

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

string * cmFileAPI::ComputeSuffixTime(string *__return_storage_ptr__,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  allocator<char> local_1d2;
  cmTimestamp cmts;
  string local_1d0;
  string local_1b0;
  ostringstream ss;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"%Y-%m-%dT%H-%M-%S",&local_1d2);
  cmTimestamp::CreateTimestampFromTimeT(&local_1b0,&cmts,lVar1 / 1000000000,&local_1d0,true);
  poVar2 = std::operator<<((ostream *)&ss,(string *)&local_1b0);
  poVar2 = std::operator<<(poVar2,'-');
  poVar2 = std::operator<<(poVar2,0x30);
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ComputeSuffixTime(std::string const&)
{
  std::chrono::milliseconds ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(
      std::chrono::system_clock::now().time_since_epoch());
  std::chrono::seconds s =
    std::chrono::duration_cast<std::chrono::seconds>(ms);

  std::time_t ts = s.count();
  std::size_t tms = ms.count() % 1000;

  cmTimestamp cmts;
  std::ostringstream ss;
  ss << cmts.CreateTimestampFromTimeT(ts, "%Y-%m-%dT%H-%M-%S", true) << '-'
     << std::setfill('0') << std::setw(4) << tms;
  return ss.str();
}